

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readline.c
# Opt level: O1

char * mpt_readline(char *prompt)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  anon_union_8_2_61bd1b83 aVar4;
  ushort **ppuVar5;
  long *plVar6;
  anon_union_8_2_61bd1b83 unaff_R13;
  
LAB_00101c07:
  do {
    if (mpt_readline::r.fcn != (_func_char_ptr_char_ptr *)0x0) {
      pcVar3 = (*mpt_readline::r.fcn)(prompt);
      aVar4 = mpt_readline::h;
      if (((pcVar3 != (char *)0x0 && mpt_readline::h.fcn != (_func_char_ptr_char_ptr *)0x0) &&
          (cVar1 = *pcVar3, (long)cVar1 != 0)) &&
         (ppuVar5 = __ctype_b_loc(), (*(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1) & 0x20) == 0))
      {
        (*aVar4.fcn)(pcVar3);
      }
      return pcVar3;
    }
    pcVar3 = getenv("MALLOC_TRACE");
    if (pcVar3 != (char *)0x0) {
      fputs("disabled readline support for memory tracing\n",_stderr);
      mpt_readline::h.fcn = (_func_char_ptr_char_ptr *)0x0;
      mpt_readline::r.fcn = _readline;
      pcVar3 = _readline(prompt);
      return pcVar3;
    }
    mpt_readline::r.fcn = (_func_char_ptr_char_ptr *)dlsym(lib_glob,"readline");
    if (mpt_readline::r.fcn == (_func_char_ptr_char_ptr *)0x0) {
      pcVar3 = "libreadline.so.7";
      plVar6 = (long *)(open_backend_backends + 8);
      mpt_readline::r.fcn = (_func_char_ptr_char_ptr *)0x0;
      do {
        lib_glob = (void *)dlopen(pcVar3,1);
        if (lib_glob == (void *)0x0) {
          bVar2 = false;
        }
        else {
          aVar4.fcn = (_func_char_ptr_char_ptr *)dlsym(lib_glob,"readline");
          if (aVar4.fcn == (_func_char_ptr_char_ptr *)0x0) {
            dlclose(lib_glob);
            bVar2 = false;
          }
          else {
            atexit(close_readline);
            bVar2 = true;
            unaff_R13.fcn = aVar4.fcn;
          }
        }
        if (bVar2) goto LAB_00101cbb;
        pcVar3 = (char *)*plVar6;
        plVar6 = plVar6 + 1;
      } while (pcVar3 != (char *)0x0);
      unaff_R13.fcn = (_func_char_ptr_char_ptr *)0x0;
LAB_00101cbb:
      mpt_readline::r = unaff_R13;
      if (unaff_R13.fcn == (_func_char_ptr_char_ptr *)0x0) {
        mpt_readline::r.fcn = _readline;
        mpt_readline::h.fcn = (_func_char_ptr_char_ptr *)0x0;
        goto LAB_00101c07;
      }
    }
    mpt_readline::h.fcn = (_func_char_ptr_char_ptr *)dlsym(lib_glob,"add_history");
  } while( true );
}

Assistant:

extern char *mpt_readline(const char *prompt)
{
	static union {
		char *(*fcn)(const char *);
		void *addr;
	} r = { 0 }, h;
	
	/* backend already selected */
	if (r.fcn) {
		char *ret = r.fcn(prompt);
		if (h.fcn && ret && *ret && !isspace(*ret)) {
			h.fcn(ret);
		}
		return ret;
	}
	/* no 3rd party allocations */
	if (getenv("MALLOC_TRACE")) {
		fputs("disabled readline support for memory tracing\n", stderr);
		h.addr = 0;
		return (r.fcn = _readline)(prompt);
	}
	/* use linked implementation */
	r.addr = dlsym(lib_glob, "readline");
	
	/* alternate shared lib implementation */
	if (r.addr || (r.addr = open_backend())) {
		h.addr = dlsym(lib_glob, "add_history");
	}
	/* fallback implementation */
	else {
		r.fcn = _readline;
		h.addr = 0;
	}
	/* (re)call with defined backend */
	return mpt_readline(prompt);
}